

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O2

void rep0_ctx_close(void *arg)

{
  nni_mtx *mtx;
  nni_aio *pnVar1;
  long lVar2;
  
  mtx = *arg;
  nni_mtx_lock(mtx);
  pnVar1 = *(nni_aio **)((long)arg + 0x18);
  if (pnVar1 != (nni_aio *)0x0) {
    lVar2 = *(long *)((long)arg + 0x10);
    *(undefined8 *)((long)arg + 0x10) = 0;
    *(undefined8 *)((long)arg + 0x18) = 0;
    nni_list_remove((nni_list *)(lVar2 + 0x3b8),arg);
    nni_aio_finish_error(pnVar1,NNG_ECLOSED);
  }
  pnVar1 = *(nni_aio **)((long)arg + 0x20);
  if (pnVar1 != (nni_aio *)0x0) {
    nni_list_remove((nni_list *)((long)&mtx[3].mtx + 8),arg);
    *(undefined8 *)((long)arg + 0x20) = 0;
    nni_aio_finish_error(pnVar1,NNG_ECLOSED);
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
rep0_ctx_close(void *arg)
{
	rep0_ctx  *ctx = arg;
	rep0_sock *s   = ctx->sock;
	nni_aio   *aio;

	nni_mtx_lock(&s->lk);
	if ((aio = ctx->saio) != NULL) {
		rep0_pipe *pipe = ctx->spipe;
		ctx->saio       = NULL;
		ctx->spipe      = NULL;
		nni_list_remove(&pipe->sendq, ctx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}
	if ((aio = ctx->raio) != NULL) {
		nni_list_remove(&s->recvq, ctx);
		ctx->raio = NULL;
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}
	nni_mtx_unlock(&s->lk);
}